

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsfs(bifcxdef *ctx,int argc)

{
  undefined2 uVar1;
  voccxdef *ctx_00;
  long lVar2;
  runcxdef *ctx_01;
  long in_RDI;
  voccxdef *voc;
  runsdef val;
  uint tm;
  objnum func;
  int in_stack_ffffffffffffffbc;
  runcxdef *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 local_28;
  
  ctx_00 = *(voccxdef **)(*(long *)(in_RDI + 8) + 0x70);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\n') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  uVar1 = *(undefined2 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  ctx_01 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
  local_28 = (char)*(undefined8 *)(lVar2 + -0x10);
  if ((local_28 != '\a') && (local_28 != '\x03')) {
    vocsetfd(ctx_00,(vocddef *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffc8),
             (objnum)((ulong)ctx_01 >> 0x30),(prpnum)((ulong)ctx_01 >> 0x20),(uint)ctx_01,
             (runsdef *)CONCAT44(in_stack_ffffffffffffffbc,0x405),(int)*(undefined8 *)(lVar2 + -8));
    return;
  }
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
  runsign(ctx_01,in_stack_ffffffffffffffbc);
}

Assistant:

void bifsfs(bifcxdef *ctx, int argc)
{
    objnum    func;
    uint      tm;
    runsdef   val;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 3, argc);            /* check for proper argument count */
    func = runpopfn(ctx->bifcxrun);
    tm = runpopnum(ctx->bifcxrun);
    runpop(ctx->bifcxrun, &val);
    
    /* limitation:  don't allow string or list for value */
    if (val.runstyp == DAT_LIST || val.runstyp == DAT_SSTRING)
        runsig(ctx->bifcxrun, ERR_FUSEVAL);
    
    vocsetfd(voc, voc->voccxfus, func, (prpnum)0,
             tm, &val, ERR_MANYFUS);
}